

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O2

bool __thiscall lsim::SimComponent::read_pin_checked(SimComponent *this,uint32_t index)

{
  pointer puVar1;
  Value VVar2;
  
  puVar1 = (this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(this->m_pins).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2)) {
    VVar2 = Simulator::read_pin(this->m_sim,puVar1[index]);
    this->m_read_bad = (bool)(this->m_read_bad | VALUE_TRUE < VVar2);
    return VVar2 != VALUE_FALSE;
  }
  __assert_fail("index < m_pins.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_component.cpp"
                ,0x4b,"bool lsim::SimComponent::read_pin_checked(uint32_t)");
}

Assistant:

bool SimComponent::read_pin_checked(uint32_t index) {
	assert(index < m_pins.size());
	auto value = m_sim->read_pin(m_pins[index]);
	m_read_bad |= (value != VALUE_TRUE && value != VALUE_FALSE);
	return static_cast<bool>(value);
}